

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

archive_entry * archive_entry_new2(archive *a)

{
  archive_entry *paVar1;
  
  paVar1 = (archive_entry *)calloc(1,0x500);
  if (paVar1 != (archive_entry *)0x0) {
    paVar1->archive = a;
  }
  return paVar1;
}

Assistant:

struct archive_entry *
archive_entry_new2(struct archive *a)
{
	struct archive_entry *entry;

	entry = (struct archive_entry *)calloc(1, sizeof(*entry));
	if (entry == NULL)
		return (NULL);
	entry->archive = a;
	entry->ae_symlink_type = AE_SYMLINK_TYPE_UNDEFINED;
	return (entry);
}